

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubsub.c
# Opt level: O0

int main(void)

{
  FILE *pFVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  uint *puVar6;
  bool bVar7;
  undefined8 local_30;
  size_t sz;
  char buf [8];
  int sub2;
  int sub1;
  int pub2;
  int pub1;
  int rc;
  
  iVar2 = test_socket_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/pubsub.c"
                           ,0x28,1,0x20);
  test_bind_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/pubsub.c"
                 ,0x29,iVar2,"inproc://a");
  buf._4_4_ = test_socket_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/pubsub.c"
                               ,0x2a,1,0x21);
  iVar3 = nn_setsockopt(buf._4_4_,0x21,1,"",0);
  if (iVar3 != 0) {
    nn_backtrace_print();
    pFVar1 = _stderr;
    piVar4 = __errno_location();
    pcVar5 = nn_err_strerror(*piVar4);
    puVar6 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar5,(ulong)*puVar6,
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/pubsub.c",
            0x2c);
    fflush(_stderr);
    nn_err_abort();
  }
  local_30 = 8;
  iVar3 = nn_getsockopt(buf._4_4_,0x21,1,&sz,&local_30);
  bVar7 = false;
  if (iVar3 == -1) {
    iVar3 = nn_errno();
    bVar7 = iVar3 == 0x5c;
  }
  if (!bVar7) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == -1 && nn_errno () == ENOPROTOOPT",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/pubsub.c",
            0x2f);
    fflush(_stderr);
    nn_err_abort();
  }
  test_connect_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/pubsub.c"
                    ,0x30,buf._4_4_,"inproc://a");
  buf._0_4_ = test_socket_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/pubsub.c"
                               ,0x31,1,0x21);
  iVar3 = nn_setsockopt(buf._0_4_,0x21,1,"",0);
  if (iVar3 != 0) {
    nn_backtrace_print();
    pFVar1 = _stderr;
    piVar4 = __errno_location();
    pcVar5 = nn_err_strerror(*piVar4);
    puVar6 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar5,(ulong)*puVar6,
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/pubsub.c",
            0x33);
    fflush(_stderr);
    nn_err_abort();
  }
  test_connect_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/pubsub.c"
                    ,0x34,buf._0_4_,"inproc://a");
  nn_sleep(10);
  test_send_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/pubsub.c"
                 ,0x39,iVar2,"0123456789012345678901234567890123456789");
  test_recv_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/pubsub.c"
                 ,0x3a,buf._4_4_,"0123456789012345678901234567890123456789");
  test_recv_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/pubsub.c"
                 ,0x3b,buf._0_4_,"0123456789012345678901234567890123456789");
  test_close_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/pubsub.c"
                  ,0x3d,iVar2);
  test_close_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/pubsub.c"
                  ,0x3e,buf._4_4_);
  test_close_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/pubsub.c"
                  ,0x3f,buf._0_4_);
  buf._4_4_ = test_socket_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/pubsub.c"
                               ,0x43,1,0x21);
  iVar2 = nn_setsockopt(buf._4_4_,0x21,1,"",0);
  if (iVar2 != 0) {
    nn_backtrace_print();
    pFVar1 = _stderr;
    piVar4 = __errno_location();
    pcVar5 = nn_err_strerror(*piVar4);
    puVar6 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar5,(ulong)*puVar6,
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/pubsub.c",
            0x45);
    fflush(_stderr);
    nn_err_abort();
  }
  test_bind_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/pubsub.c"
                 ,0x46,buf._4_4_,"inproc://a");
  iVar2 = test_socket_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/pubsub.c"
                           ,0x47,1,0x20);
  test_connect_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/pubsub.c"
                    ,0x48,iVar2,"inproc://a");
  iVar3 = test_socket_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/pubsub.c"
                           ,0x49,1,0x20);
  test_connect_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/pubsub.c"
                    ,0x4a,iVar3,"inproc://a");
  nn_sleep(100);
  test_send_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/pubsub.c"
                 ,0x4d,iVar2,"0123456789012345678901234567890123456789");
  test_send_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/pubsub.c"
                 ,0x4e,iVar3,"0123456789012345678901234567890123456789");
  test_recv_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/pubsub.c"
                 ,0x4f,buf._4_4_,"0123456789012345678901234567890123456789");
  test_recv_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/pubsub.c"
                 ,0x50,buf._4_4_,"0123456789012345678901234567890123456789");
  test_close_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/pubsub.c"
                  ,0x52,iVar3);
  test_close_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/pubsub.c"
                  ,0x53,iVar2);
  test_close_impl("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/pubsub.c"
                  ,0x54,buf._4_4_);
  return 0;
}

Assistant:

int main ()
{
    int rc;
    int pub1;
    int pub2;
    int sub1;
    int sub2;
    char buf [8];
    size_t sz;

    pub1 = test_socket (AF_SP, NN_PUB);
    test_bind (pub1, SOCKET_ADDRESS);
    sub1 = test_socket (AF_SP, NN_SUB);
    rc = nn_setsockopt (sub1, NN_SUB, NN_SUB_SUBSCRIBE, "", 0);
    errno_assert (rc == 0);
    sz = sizeof (buf);
    rc = nn_getsockopt (sub1, NN_SUB, NN_SUB_SUBSCRIBE, buf, &sz);
    nn_assert (rc == -1 && nn_errno () == ENOPROTOOPT);
    test_connect (sub1, SOCKET_ADDRESS);
    sub2 = test_socket (AF_SP, NN_SUB);
    rc = nn_setsockopt (sub2, NN_SUB, NN_SUB_SUBSCRIBE, "", 0);
    errno_assert (rc == 0);
    test_connect (sub2, SOCKET_ADDRESS);

    /*  Wait till connections are established to prevent message loss. */
    nn_sleep (10);

    test_send (pub1, "0123456789012345678901234567890123456789");
    test_recv (sub1, "0123456789012345678901234567890123456789");
    test_recv (sub2, "0123456789012345678901234567890123456789");

    test_close (pub1);
    test_close (sub1);
    test_close (sub2);

    /*  Check receiving messages from two publishers. */

    sub1 = test_socket (AF_SP, NN_SUB);
    rc = nn_setsockopt (sub1, NN_SUB, NN_SUB_SUBSCRIBE, "", 0);
    errno_assert (rc == 0);
    test_bind (sub1, SOCKET_ADDRESS);
    pub1 = test_socket (AF_SP, NN_PUB);
    test_connect (pub1, SOCKET_ADDRESS);
    pub2 = test_socket (AF_SP, NN_PUB);
    test_connect (pub2, SOCKET_ADDRESS);
    nn_sleep (100);

    test_send (pub1, "0123456789012345678901234567890123456789");
    test_send (pub2, "0123456789012345678901234567890123456789");
    test_recv (sub1, "0123456789012345678901234567890123456789");
    test_recv (sub1, "0123456789012345678901234567890123456789");

    test_close (pub2);
    test_close (pub1);
    test_close (sub1);

    return 0;
}